

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commander.cpp
# Opt level: O3

void __thiscall Commander::clearCommands(Commander *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->cmds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->cmds)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 2) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 2) + 8))();
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
  ::clear(&(this->cmds)._M_t);
  return;
}

Assistant:

void Commander::clearCommands()
{
    std::map<std::string, Command*>::iterator itr;
    for (itr = cmds.begin(); itr != cmds.end(); ++itr) {
        Command* cmd = itr->second;
        delete cmd;
    }
    this->cmds.clear();
}